

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::LatticeImpl::set_result(LatticeImpl *this,char *result)

{
  ulong uVar1;
  unsigned_short uVar2;
  int iVar3;
  Allocator<mecab_node_t,_mecab_path_t> *pAVar4;
  size_t sVar5;
  size_type sVar6;
  reference ppcVar7;
  size_type sVar8;
  ostream *poVar9;
  char *pcVar10;
  mecab_node_t *pmVar11;
  reference ppmVar12;
  Allocator<mecab_node_t,_mecab_path_t> *pAVar13;
  ChunkFreeList<char> *pCVar14;
  char *in_RSI;
  long *in_RDI;
  Node *node;
  size_t i_1;
  Node *prev;
  size_t offset;
  Node *eos_node;
  Node *bos_node;
  char *cols [2];
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  features;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  surfaces;
  string sentence;
  size_t lsize;
  vector<char_*,_std::allocator<char_*>_> lines;
  char *str;
  value_type *in_stack_fffffffffffffd58;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_fffffffffffffd60;
  vector<char_*,_std::allocator<char_*>_> *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd88;
  char **in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  back_insert_iterator<std::vector<char_*,_std::allocator<char_*>_>_> in_stack_fffffffffffffda0;
  size_type local_130;
  Allocator<mecab_node_t,_mecab_path_t> *local_128;
  size_type local_120;
  die local_102;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  char *local_b8;
  char *local_b0;
  ulong local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70 [34];
  byte local_4e;
  die local_4d [13];
  vector<char_*,_std::allocator<char_*>_> *local_40;
  size_t local_38;
  vector<char_*,_std::allocator<char_*>_> local_30;
  char *local_18;
  char *local_10;
  
  local_10 = in_RSI;
  pAVar4 = (Allocator<mecab_node_t,_mecab_path_t> *)(**(code **)(*in_RDI + 0xb0))();
  pcVar10 = local_10;
  strlen(local_10);
  local_18 = Allocator<mecab_node_t,_mecab_path_t>::strdup(pAVar4,pcVar10);
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)0x149b45);
  local_40 = (vector<char_*,_std::allocator<char_*>_> *)
             std::back_inserter<std::vector<char*,std::allocator<char*>>>
                       ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffd58);
  strlen(local_10);
  sVar5 = tokenize<std::back_insert_iterator<std::vector<char*,std::allocator<char*>>>>
                    (in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffda0,in_stack_fffffffffffffd88);
  local_38 = sVar5;
  sVar6 = std::vector<char_*,_std::allocator<char_*>_>::size(&local_30);
  local_4e = 0;
  if (sVar5 != sVar6) {
    die::die(local_4d);
    local_4e = 1;
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x324);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"lsize == lines.size()");
    poVar9 = std::operator<<(poVar9,"] ");
    die::operator&(local_4d,poVar9);
  }
  if ((local_4e & 1) != 0) {
    die::~die((die *)0x149cf6);
  }
  std::__cxx11::string::string(local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x149d10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x149d1d);
  for (local_a8 = 0; uVar1 = local_a8,
      sVar6 = std::vector<char_*,_std::allocator<char_*>_>::size(&local_30), uVar1 < sVar6;
      local_a8 = local_a8 + 1) {
    ppcVar7 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_30,local_a8);
    iVar3 = strcmp("EOS",*ppcVar7);
    if (iVar3 == 0) break;
    std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_30,local_a8);
    sVar5 = tokenize<char**>((char *)in_stack_fffffffffffffda0.container,in_stack_fffffffffffffd98,
                             in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    if (sVar5 != 2) break;
    std::__cxx11::string::operator+=(local_70,local_b8);
    pcVar10 = local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,pcVar10,&local_d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    pcVar10 = local_b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar10,&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_a0);
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_88);
  if (sVar6 != sVar8) {
    die::die(&local_102);
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
                            );
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x335);
    poVar9 = std::operator<<(poVar9,") [");
    poVar9 = std::operator<<(poVar9,"features.size() == surfaces.size()");
    poVar9 = std::operator<<(poVar9,"] ");
    die::operator&(&local_102,poVar9);
    die::~die((die *)0x14a11f);
  }
  pAVar4 = (Allocator<mecab_node_t,_mecab_path_t> *)(**(code **)(*in_RDI + 0xb0))();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  pcVar10 = Allocator<mecab_node_t,_mecab_path_t>::strdup(pAVar4,pcVar10);
  (**(code **)(*in_RDI + 0x48))(in_RDI,pcVar10);
  (**(code **)(*in_RDI + 0xb0))();
  local_128 = (Allocator<mecab_node_t,_mecab_path_t> *)
              Allocator<mecab_node_t,_mecab_path_t>::newNode(in_stack_fffffffffffffd60);
  (local_128->char_freelist_)._vptr_scoped_ptr = (_func_int **)"BOS/EOS";
  (local_128->char_freelist_).ptr_ = (ChunkFreeList<char> *)"BOS/EOS";
  (local_128->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Tp_alloc_type = (_Tp_alloc_type)0x1;
  *(uchar *)((long)&(local_128->nbest_generator_).ptr_ + 7) = '\x02';
  (**(code **)(*in_RDI + 0xb0))();
  pmVar11 = Allocator<mecab_node_t,_mecab_path_t>::newNode(in_stack_fffffffffffffd60);
  pmVar11->surface = "BOS/EOS";
  pmVar11->feature = "BOS/EOS";
  pmVar11->isbest = '\x01';
  pmVar11->stat = '\x03';
  (local_128->char_freelist_)._vptr_scoped_ptr = (_func_int **)in_RDI[1];
  ppmVar12 = std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::operator[]
                       ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)(in_RDI + 10),0);
  *ppmVar12 = (value_type)local_128;
  local_120 = 0;
  local_130 = 0;
  while (sVar6 = local_130,
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_88), sVar6 < sVar8) {
    (**(code **)(*in_RDI + 0xb0))();
    pAVar13 = (Allocator<mecab_node_t,_mecab_path_t> *)
              Allocator<mecab_node_t,_mecab_path_t>::newNode(in_stack_fffffffffffffd60);
    pAVar13->_vptr_Allocator = (_func_int **)local_128;
    local_128->id_ = (size_t)pAVar13;
    (pAVar13->char_freelist_)._vptr_scoped_ptr = (_func_int **)(in_RDI[1] + local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_88,local_130);
    uVar2 = std::__cxx11::string::size();
    *(unsigned_short *)((long)&(pAVar13->nbest_generator_)._vptr_scoped_ptr + 4) = uVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_88,local_130);
    uVar2 = std::__cxx11::string::size();
    *(unsigned_short *)((long)&(pAVar13->nbest_generator_)._vptr_scoped_ptr + 6) = uVar2;
    (pAVar13->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Tp_alloc_type = (_Tp_alloc_type)0x1;
    *(uchar *)((long)&(pAVar13->nbest_generator_).ptr_ + 7) = '\0';
    *(short *)&(pAVar13->partial_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               field_0x10 = 0;
    (pAVar13->results_)._vptr_scoped_array = (_func_int **)0x0;
    pAVar4 = (Allocator<mecab_node_t,_mecab_path_t> *)(**(code **)(*in_RDI + 0xb0))();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_a0,local_130);
    in_stack_fffffffffffffd70 =
         (vector<char_*,_std::allocator<char_*>_> *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_a0,local_130);
    std::__cxx11::string::size();
    pCVar14 = (ChunkFreeList<char> *)
              Allocator<mecab_node_t,_mecab_path_t>::strdup
                        (pAVar4,(char *)in_stack_fffffffffffffd70);
    (pAVar13->char_freelist_).ptr_ = pCVar14;
    pAVar4 = pAVar13;
    ppmVar12 = std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::operator[]
                         ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)(in_RDI + 0xd),
                          local_120);
    *ppmVar12 = (value_type)pAVar4;
    in_stack_fffffffffffffd60 = pAVar13;
    ppmVar12 = std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::operator[]
                         ((vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *)(in_RDI + 10),
                          local_120 +
                          *(unsigned_short *)
                           ((long)&(pAVar13->nbest_generator_)._vptr_scoped_ptr + 4));
    *ppmVar12 = (value_type)in_stack_fffffffffffffd60;
    local_120 = *(unsigned_short *)((long)&(pAVar13->nbest_generator_)._vptr_scoped_ptr + 4) +
                local_120;
    local_130 = local_130 + 1;
    local_128 = pAVar13;
  }
  local_128->id_ = (size_t)pmVar11;
  pmVar11->prev = (mecab_node_t *)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd70);
  std::__cxx11::string::~string(local_70);
  std::vector<char_*,_std::allocator<char_*>_>::~vector(in_stack_fffffffffffffd70);
  return;
}

Assistant:

void LatticeImpl::set_result(const char *result) {
  char *str = allocator()->strdup(result, std::strlen(result));
  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                std::strlen(result));
  CHECK_DIE(lsize == lines.size());

  std::string sentence;
  std::vector<std::string> surfaces, features;
  for (size_t i = 0; i < lines.size(); ++i) {
    if (::strcmp("EOS", lines[i]) == 0) {
      break;
    }
    char *cols[2];
    if (tokenize(lines[i], "\t", cols, 2) != 2) {
      break;
    }
    sentence += cols[0];
    surfaces.push_back(cols[0]);
    features.push_back(cols[1]);
  }

  CHECK_DIE(features.size() == surfaces.size());

  set_sentence(allocator()->strdup(sentence.c_str(), sentence.size()));

  Node *bos_node = allocator()->newNode();
  bos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  bos_node->feature = "BOS/EOS";
  bos_node->isbest = 1;
  bos_node->stat = MECAB_BOS_NODE;

  Node *eos_node = allocator()->newNode();
  eos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  eos_node->feature = "BOS/EOS";
  eos_node->isbest = 1;
  eos_node->stat = MECAB_EOS_NODE;

  bos_node->surface = sentence_;
  end_nodes_[0] = bos_node;

  size_t offset = 0;
  Node *prev = bos_node;
  for (size_t i = 0; i < surfaces.size(); ++i) {
    Node *node = allocator()->newNode();
    node->prev = prev;
    prev->next = node;
    node->surface = sentence_ + offset;
    node->length = surfaces[i].size();
    node->rlength = surfaces[i].size();
    node->isbest = 1;
    node->stat = MECAB_NOR_NODE;
    node->wcost = 0;
    node->cost = 0;
    node->feature = allocator()->strdup(features[i].c_str(),
                                        features[i].size());
    begin_nodes_[offset] = node;
    end_nodes_[offset + node->length] = node;
    offset += node->length;
    prev = node;
  }

  prev->next = eos_node;
  eos_node->prev = prev;
}